

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCommandLineOption>::emplace<QCommandLineOption>
          (QMovableArrayOps<QCommandLineOption> *this,qsizetype i,QCommandLineOption *args)

{
  QCommandLineOption **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QCommandLineOption *pQVar4;
  QCommandLineOption *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QCommandLineOption tmp;
  Inserter local_60;
  QCommandLineOption local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCommandLineOption>).
           super_QArrayDataPointer<QCommandLineOption>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0027960a:
    local_38.d.d.ptr = (QSharedDataPointer<QCommandLineOptionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QCommandLineOption::QCommandLineOption(&local_38,args);
    bVar6 = (this->super_QGenericArrayOps<QCommandLineOption>).
            super_QArrayDataPointer<QCommandLineOption>.size != 0;
    QArrayDataPointer<QCommandLineOption>::detachAndGrow
              ((QArrayDataPointer<QCommandLineOption> *)this,(uint)(i == 0 && bVar6),1,
               (QCommandLineOption **)0x0,(QArrayDataPointer<QCommandLineOption> *)0x0);
    if (i == 0 && bVar6) {
      QCommandLineOption::QCommandLineOption
                ((this->super_QGenericArrayOps<QCommandLineOption>).
                 super_QArrayDataPointer<QCommandLineOption>.ptr + -1,&local_38);
      ppQVar1 = &(this->super_QGenericArrayOps<QCommandLineOption>).
                 super_QArrayDataPointer<QCommandLineOption>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QCommandLineOption>).
                super_QArrayDataPointer<QCommandLineOption>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QCommandLineOption>).
               super_QArrayDataPointer<QCommandLineOption>.ptr;
      pQVar4 = pQVar5 + i;
      pQVar5 = pQVar5 + i + 1;
      local_60.nInserts = 1;
      local_60.bytes =
           ((this->super_QGenericArrayOps<QCommandLineOption>).
            super_QArrayDataPointer<QCommandLineOption>.size - i) * 8;
      local_60.data = (QArrayDataPointer<QCommandLineOption> *)this;
      local_60.displaceFrom = pQVar4;
      local_60.displaceTo = pQVar5;
      memmove(pQVar5,pQVar4,local_60.bytes);
      QCommandLineOption::QCommandLineOption(pQVar4,&local_38);
      local_60.displaceFrom = pQVar5;
      Inserter::~Inserter(&local_60);
    }
    QCommandLineOption::~QCommandLineOption(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QCommandLineOption>).
         super_QArrayDataPointer<QCommandLineOption>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QCommandLineOption>).
                 super_QArrayDataPointer<QCommandLineOption>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      QCommandLineOption::QCommandLineOption(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QCommandLineOption>).
                   super_QArrayDataPointer<QCommandLineOption>.ptr,
         (QCommandLineOption *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_0027960a;
      QCommandLineOption::QCommandLineOption(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QCommandLineOption>).
                 super_QArrayDataPointer<QCommandLineOption>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QCommandLineOption>).
              super_QArrayDataPointer<QCommandLineOption>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }